

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int next_code(archive_read_filter *self)

{
  undefined1 uVar1;
  undefined4 uVar2;
  _func_int_archive_read_filter_ptr *p_Var3;
  undefined1 *puVar4;
  int iVar5;
  ulong uVar6;
  long in_RDI;
  int skip_bytes;
  int newcode;
  int code;
  private_data *state;
  int local_24;
  int in_stack_ffffffffffffffe4;
  uint uVar7;
  archive_read_filter *self_00;
  uint local_4;
  
  self_00 = *(archive_read_filter **)(in_RDI + 0x50);
  local_4 = getbits(self_00,in_stack_ffffffffffffffe4);
  if (-1 < (int)local_4) {
    uVar6 = (ulong)next_code::debug_index;
    next_code::debug_index = next_code::debug_index + 1;
    next_code::debug_buff[uVar6] = local_4;
    if (0x3ff < next_code::debug_index) {
      next_code::debug_index = 0;
    }
    if ((local_4 == 0x100) && (*(int *)&self_00->seek != 0)) {
      p_Var3 = self_00->open;
      *(undefined4 *)((long)&self_00->archive + 4) = 0;
      local_4 = 0x100;
      local_24 = (*(int *)((long)&self_00->sswitch + 4) -
                 (int)((ulong)p_Var3 % (ulong)(long)*(int *)((long)&self_00->sswitch + 4))) %
                 *(int *)((long)&self_00->sswitch + 4);
      do {
        if (local_24 < 1) {
          self_00->open = (_func_int_archive_read_filter_ptr *)0x0;
          *(undefined4 *)((long)&self_00->sswitch + 4) = 9;
          *(int *)&self_00->sswitch =
               (1 << ((byte)*(undefined4 *)((long)&self_00->sswitch + 4) & 0x1f)) + -1;
          *(undefined4 *)&self_00->name = 0x101;
          *(undefined4 *)&self_00->data = 0xffffffff;
          iVar5 = next_code(self_00);
          return iVar5;
        }
        local_4 = getbits(self_00,local_4);
        local_24 = local_24 + -1;
      } while (-1 < (int)local_4);
    }
    else if (*(int *)&self_00->name < (int)local_4) {
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,"Invalid compressed data");
      local_4 = 0xffffffe2;
    }
    else {
      uVar7 = local_4;
      if (*(int *)&self_00->name <= (int)local_4) {
        uVar2 = *(undefined4 *)((long)&self_00->data + 4);
        puVar4 = (undefined1 *)self_00[0x45d].buffer_size;
        self_00[0x45d].buffer_size = (size_t)(puVar4 + 1);
        *puVar4 = (char)uVar2;
        uVar7 = *(uint *)&self_00->data;
      }
      for (; 0xff < (int)uVar7;
          uVar7 = (uint)*(ushort *)((long)&self_00[0x174].client_next + (long)(int)uVar7 * 2 + 4)) {
        uVar1 = *(undefined1 *)((long)&self_00->name + (long)(int)uVar7 + 4);
        puVar4 = (undefined1 *)self_00[0x45d].buffer_size;
        self_00[0x45d].buffer_size = (size_t)(puVar4 + 1);
        *puVar4 = uVar1;
      }
      *(uint *)((long)&self_00->data + 4) = uVar7;
      puVar4 = (undefined1 *)self_00[0x45d].buffer_size;
      self_00[0x45d].buffer_size = (size_t)(puVar4 + 1);
      *puVar4 = (char)uVar7;
      iVar5 = *(int *)&self_00->name;
      if ((iVar5 < *(int *)&self_00->close) && (-1 < *(int *)&self_00->data)) {
        *(short *)((long)&self_00[0x174].client_next + (long)iVar5 * 2 + 4) =
             (short)*(undefined4 *)&self_00->data;
        *(char *)((long)&self_00->name + (long)iVar5 + 4) =
             (char)*(undefined4 *)((long)&self_00->data + 4);
        *(int *)&self_00->name = *(int *)&self_00->name + 1;
      }
      if (*(int *)&self_00->sswitch < *(int *)&self_00->name) {
        *(int *)((long)&self_00->sswitch + 4) = *(int *)((long)&self_00->sswitch + 4) + 1;
        self_00->open = (_func_int_archive_read_filter_ptr *)0x0;
        if (*(int *)((long)&self_00->sswitch + 4) == *(int *)((long)&self_00->close + 4)) {
          *(undefined4 *)&self_00->sswitch = *(undefined4 *)&self_00->close;
        }
        else {
          *(int *)&self_00->sswitch =
               (1 << ((byte)*(undefined4 *)((long)&self_00->sswitch + 4) & 0x1f)) + -1;
        }
      }
      *(uint *)&self_00->data = local_4;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
next_code(struct archive_read_filter *self)
{
	struct private_data *state = (struct private_data *)self->data;
	int code, newcode;

	static int debug_buff[1024];
	static unsigned debug_index;

	code = newcode = getbits(self, state->bits);
	if (code < 0)
		return (code);

	debug_buff[debug_index++] = code;
	if (debug_index >= sizeof(debug_buff)/sizeof(debug_buff[0]))
		debug_index = 0;

	/* If it's a reset code, reset the dictionary. */
	if ((code == 256) && state->use_reset_code) {
		/*
		 * The original 'compress' implementation blocked its
		 * I/O in a manner that resulted in junk bytes being
		 * inserted after every reset.  The next section skips
		 * this junk.  (Yes, the number of *bytes* to skip is
		 * a function of the current *bit* length.)
		 */
		int skip_bytes =  state->bits -
		    (state->bytes_in_section % state->bits);
		skip_bytes %= state->bits;
		state->bits_avail = 0; /* Discard rest of this byte. */
		while (skip_bytes-- > 0) {
			code = getbits(self, 8);
			if (code < 0)
				return (code);
		}
		/* Now, actually do the reset. */
		state->bytes_in_section = 0;
		state->bits = 9;
		state->section_end_code = (1 << state->bits) - 1;
		state->free_ent = 257;
		state->oldcode = -1;
		return (next_code(self));
	}

	if (code > state->free_ent) {
		/* An invalid code is a fatal error. */
		archive_set_error(&(self->archive->archive), -1,
		    "Invalid compressed data");
		return (ARCHIVE_FATAL);
	}

	/* Special case for KwKwK string. */
	if (code >= state->free_ent) {
		*state->stackp++ = state->finbyte;
		code = state->oldcode;
	}

	/* Generate output characters in reverse order. */
	while (code >= 256) {
		*state->stackp++ = state->suffix[code];
		code = state->prefix[code];
	}
	*state->stackp++ = state->finbyte = code;

	/* Generate the new entry. */
	code = state->free_ent;
	if (code < state->maxcode && state->oldcode >= 0) {
		state->prefix[code] = state->oldcode;
		state->suffix[code] = state->finbyte;
		++state->free_ent;
	}
	if (state->free_ent > state->section_end_code) {
		state->bits++;
		state->bytes_in_section = 0;
		if (state->bits == state->maxcode_bits)
			state->section_end_code = state->maxcode;
		else
			state->section_end_code = (1 << state->bits) - 1;
	}

	/* Remember previous code. */
	state->oldcode = newcode;
	return (ARCHIVE_OK);
}